

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O3

void __thiscall Generator::Generate(Generator *this)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  pointer pcVar3;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Tuple_impl<2UL,_double> _Var4;
  _Head_base<0UL,_int,_false> _Var5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  iterator iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  Util *this_01;
  int iVar12;
  pointer ppVar13;
  _Alloc_hider _Var14;
  long lVar15;
  char cVar16;
  size_t sVar17;
  ulong uVar18;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar19;
  _Iter_less_iter __comp;
  tuple<int,_double,_double> eval_stats;
  char puzzle [729];
  key_type local_380;
  _Base_ptr local_360;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_358;
  vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
  *local_350;
  double local_348;
  size_t local_340;
  Util *local_338;
  tuple<int,_double,_double> local_330;
  int local_318 [20];
  undefined1 local_2c7;
  
  bVar1 = (this->options_).pencilmark;
  sVar17 = 0x51;
  if (bVar1 != false) {
    sVar17 = 0x2d9;
  }
  if ((this->options_).max_puzzles != 0) {
    this_01 = &this->util_;
    local_350 = (vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
                 *)&this->pattern_heap;
    local_358 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->pattern_set;
    local_360 = &(this->pattern_set)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar18 = 0;
    local_340 = sVar17;
    local_338 = this_01;
    do {
      uVar7 = Util::RandomUInt(this_01);
      ppVar13 = (this->pattern_heap).
                super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ulong)uVar7 %
               (ulong)(((long)(this->pattern_heap).
                              super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13 >> 3) *
                      -0x3333333333333333);
      memcpy(local_318,ppVar13[uVar11].second._M_dataplus._M_p,sVar17);
      if (bVar1 == false) {
        local_2c7 = 0;
      }
      Util::Permutation((vector<int,_std::allocator<int>_> *)&local_380,this_01,sVar17);
      if (local_380._M_dataplus._M_p != (pointer)local_380._M_string_length) {
        iVar8 = (this->options_).clues_to_drop;
        bVar6 = (this->options_).pencilmark;
        iVar12 = 0;
        _Var14._M_p = local_380._M_dataplus._M_p;
        do {
          if (iVar12 == iVar8) break;
          iVar2 = *(int *)_Var14._M_p;
          lVar15 = (long)iVar2;
          if (*(char *)((long)local_318 + lVar15) == '.') {
            if ((bVar6 & 1U) != 0) {
              cVar16 = (char)iVar2 +
                       ((char)(uint)((ulong)(lVar15 * 0x38e38e39) >> 0x21) - (char)(iVar2 >> 0x1f))
                       * -9 + '1';
LAB_001041c3:
              iVar12 = iVar12 + 1;
              *(char *)((long)local_318 + lVar15) = cVar16;
            }
          }
          else {
            cVar16 = '.';
            if ((bVar6 & 1U) == 0) goto LAB_001041c3;
          }
          _Var14._M_p = _Var14._M_p + 4;
        } while (_Var14._M_p != (pointer)local_380._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_380._M_dataplus._M_p,
                        local_380.field_2._M_allocated_capacity - (long)local_380._M_dataplus._M_p);
      }
      if ((this->options_).clues_to_drop < 1) {
LAB_00104220:
        Evaluate(&local_330,this,(char *)local_318);
        _Var5._M_head_impl =
             local_330.super__Tuple_impl<0UL,_int,_double,_double>.super__Head_base<0UL,_int,_false>
             ._M_head_impl;
        _Var4.super__Head_base<2UL,_double,_false>._M_head_impl =
             local_330.super__Tuple_impl<0UL,_int,_double,_double>.
             super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
             super__Head_base<2UL,_double,_false>._M_head_impl;
        local_348 = local_330.super__Tuple_impl<0UL,_int,_double,_double>.
                    super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                    _M_head_impl;
        if ((this->options_).clues_to_drop < 1) {
LAB_001042e2:
          if ((this->options_).display_all == true) {
            printf("%.729s %d %.1f %.2f\n",local_348,
                   _Var4.super__Head_base<2UL,_double,_false>._M_head_impl,local_318,
                   (ulong)(uint)_Var5._M_head_impl);
          }
          this_01 = local_338;
          sVar17 = local_340;
          if ((double)_Var4.super__Head_base<2UL,_double,_false>._M_head_impl <=
              **(double **)local_350) {
            if ((this->options_).display_all == false) {
              printf("%.729s %d %.1f %.2f\n",local_348,
                     _Var4.super__Head_base<2UL,_double,_false>._M_head_impl,local_318,
                     (ulong)(uint)_Var5._M_head_impl);
            }
            local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
            sVar17 = strlen((char *)local_318);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_380,local_318,(long)local_318 + sVar17);
            this_00 = local_358;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>(local_358,&local_380);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            local_380._M_string_length = (size_type)local_318;
            local_380._M_dataplus._M_p =
                 (pointer)_Var4.super__Head_base<2UL,_double,_false>._M_head_impl;
            std::
            vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
            ::emplace_back<std::pair<double,char*>>(local_350,(pair<double,_char_*> *)&local_380);
            std::
            push_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>>
                      ((this->pattern_heap).
                       super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->pattern_heap).
                       super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            ppVar13 = (this->pattern_heap).
                      super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __first._M_current =
                 (this->pattern_heap).
                 super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if (0x28 < (long)ppVar13 - (long)__first._M_current) {
              std::
              __pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (__first,ppVar13 + -1,ppVar13 + -1,(_Iter_less_iter *)&local_380);
              ppVar13 = (this->pattern_heap).
                        super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_00,&ppVar13[-1].second);
            if (iVar9._M_node != local_360) {
              pVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)this_00,
                                     &(this->pattern_heap).
                                      super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[-1].second);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this_00,(_Base_ptr)pVar19.first._M_node,
                             (_Base_ptr)pVar19.second._M_node);
            }
            ppVar13 = (this->pattern_heap).
                      super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (this->pattern_heap).
            super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar13 + -1;
            pcVar3 = ppVar13[-1].second._M_dataplus._M_p;
            paVar10 = &ppVar13[-1].second.field_2;
            this_01 = local_338;
            sVar17 = local_340;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar10) {
              operator_delete(pcVar3,paVar10->_M_allocated_capacity + 1);
              this_01 = local_338;
              sVar17 = local_340;
            }
          }
        }
        else {
          iVar8 = strncmp((char *)local_318,ppVar13[uVar11].second._M_dataplus._M_p,0x2d9);
          this_01 = local_338;
          sVar17 = local_340;
          if (iVar8 != 0) {
            local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
            sVar17 = strlen((char *)local_318);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_380,local_318,(long)local_318 + sVar17);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_358,&local_380);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            this_01 = local_338;
            sVar17 = local_340;
            if (iVar9._M_node == local_360) goto LAB_001042e2;
          }
        }
      }
      else {
        bVar6 = TdokuConstrain((this->options_).pencilmark,(char *)local_318);
        if (bVar6) {
          if ((this->options_).minimize == true) {
            TdokuMinimize((this->options_).pencilmark,false,(char *)local_318);
          }
          goto LAB_00104220;
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (this->options_).max_puzzles);
  }
  return;
}

Assistant:

void Generate() {
        char puzzle[729];

        size_t size = options_.pencilmark ? 729 : 81;
        for (uint64_t i = 0; i < options_.max_puzzles; i++) {
            // draw a puzzle or pattern from the pool
            size_t which = util_.RandomUInt() % pattern_heap.size();
            string &pattern = pattern_heap[which].second;
            memcpy(puzzle, pattern.c_str(), size);
            if (size == 81) puzzle[81] = '\0';

            // randomly drop clues to unconstrain
            int dropped = 0;
            for (int j : util_.Permutation(size)) {
                if (dropped == options_.clues_to_drop) {
                    break;
                }
                if (puzzle[j] == '.') {
                    if (options_.pencilmark) {
                        puzzle[j] = (char) ('1' + (j % 9));
                        dropped++;
                    }
                } else {
                    if (!options_.pencilmark) {
                        puzzle[j] = '.';
                        dropped++;
                    }
                }
            }

            // randomly complete and minimize

            if (options_.clues_to_drop > 0) {
                if (!TdokuConstrain(options_.pencilmark, puzzle)) {
                    continue;
                }
                if (options_.minimize) {
                    TdokuMinimize(options_.pencilmark, false, puzzle);
                }
            }

            // evaluate difficulty via guess counting
            auto eval_stats = Evaluate(puzzle);
            int num_clues = get<0>(eval_stats);
            double geo_mean_guesses = get<1>(eval_stats);
            double loss = get<2>(eval_stats);

            // skip if the puzzle is a duplicate of one still in the pool
            if (options_.clues_to_drop > 0) {
                if (strncmp(puzzle, pattern.c_str(), 729) == 0) {
                    continue;
                }
                if (pattern_set.find(puzzle) != pattern_set.end()) {
                    continue;
                }
            }

            if (options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // skip if the puzzle's loss is greater than the highest in the pool
            if (loss > pattern_heap.front().first) {
                continue;
            }

            if (!options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // add the generated puzzle to the pool and kick out the one with highest loss
            pattern_set.insert(puzzle);
            pattern_heap.emplace_back(make_pair(loss, puzzle));
            push_heap(pattern_heap.begin(), pattern_heap.end());
            pop_heap(pattern_heap.begin(), pattern_heap.end());
            if (pattern_set.find(pattern_heap.back().second) != pattern_set.end()) {
                pattern_set.erase(pattern_heap.back().second);
            }
            pattern_heap.pop_back();
        }
    }